

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O0

uint8_t mpeg_bitstream_packet_type(mpeg_bitstream_t *packet,uint stream_type)

{
  uint stream_type_local;
  mpeg_bitstream_t *packet_local;
  byte local_1;
  
  if (packet->size < 4) {
    local_1 = 0;
  }
  else if (stream_type == 2) {
    local_1 = packet->data[3];
  }
  else if (stream_type == 0x1b) {
    local_1 = packet->data[3] & 0x1f;
  }
  else if (stream_type == 0x24) {
    local_1 = (byte)((int)(uint)packet->data[3] >> 1) & 0x3f;
  }
  else {
    local_1 = 0;
  }
  return local_1;
}

Assistant:

uint8_t mpeg_bitstream_packet_type(mpeg_bitstream_t* packet, unsigned stream_type)
{
    if (4 > packet->size) {
        return 0;
    }
    switch (stream_type) {
    case STREAM_TYPE_H262:
        return packet->data[3];
    case STREAM_TYPE_H264:
        return packet->data[3] & 0x1F;
    case STREAM_TYPE_H265:
        return (packet->data[3] >> 1) & 0x3F;
    default:
        return 0;
    }
}